

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_22::Scanner::create(Scanner *this)

{
  Scanner *this_local;
  
  this_local = this;
  std::make_unique<wasm::(anonymous_namespace)::Scanner,wasm::(anonymous_namespace)::OptInfo&>
            ((OptInfo *)&stack0xffffffffffffffe0);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::Scanner,std::default_delete<wasm::(anonymous_namespace)::Scanner>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::(anonymous_namespace)::Scanner,_std::default_delete<wasm::(anonymous_namespace)::Scanner>_>
              *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<wasm::(anonymous_namespace)::Scanner,_std::default_delete<wasm::(anonymous_namespace)::Scanner>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::Scanner,_std::default_delete<wasm::(anonymous_namespace)::Scanner>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<Scanner>(optInfo);
  }